

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O0

void __thiscall
OpenMD::BondAngleDistribution::writeBondAngleDistribution(BondAngleDistribution *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *this_00;
  ulong uVar4;
  reference pvVar5;
  undefined8 uVar6;
  StaticAnalyser *in_RDI;
  double dVar7;
  RealType Thetaval;
  int i;
  Revision r;
  ofstream ofs;
  RealType norm;
  Revision *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  string local_290 [32];
  double local_270;
  int local_264;
  string local_260 [32];
  string local_240 [48];
  ostream local_210 [512];
  double local_10;
  
  dVar7 = (double)*(int *)&in_RDI[9].outputFilename_.field_2;
  local_10 = dVar7 * (dVar7 + -1.0) * 0.5;
  StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"BondAngleDistribution: unable to open %s\n",uVar6);
    std::__cxx11::string::~string(local_290);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<(local_210,"# ");
    this_00 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar3 = std::operator<<(poVar3,(string *)this_00);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_210,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((Revision *)this_00);
    poVar3 = std::operator<<(poVar3,local_240);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_240);
    poVar3 = std::operator<<(local_210,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffcf8);
    poVar3 = std::operator<<(poVar3,local_260);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_260);
    poVar3 = std::operator<<(local_210,"# selection script: \"");
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI[1].info_);
    std::operator<<(poVar3,"\"\n");
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar3 = std::operator<<(local_210,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI->paramString_);
      std::operator<<(poVar3,"\n");
    }
    for (local_264 = 0; local_264 < *(int *)((long)&in_RDI[9].info_ + 4); local_264 = local_264 + 1)
    {
      local_270 = (double)local_264 * *(double *)&in_RDI[9].dumpFilename_;
      std::ostream::operator<<(local_210,local_270);
      poVar3 = std::operator<<(local_210,"\t");
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[9].step_,(long)local_264);
      std::ostream::operator<<
                (poVar3,((double)*pvVar5 / local_10) / (double)*(int *)&in_RDI[9].info_);
      std::operator<<(local_210,"\n");
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void BondAngleDistribution::writeBondAngleDistribution() {
    RealType norm = (RealType)nTotBonds_ * ((RealType)nTotBonds_ - 1.0) / 2.0;

    std::ofstream ofs(getOutputFileName().c_str());

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Thetaval = i * deltaTheta_;
        ofs << Thetaval;
        ofs << "\t" << (RealType)histogram_[i] / norm / frameCounter_;
        ofs << "\n";
      }

      ofs.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondAngleDistribution: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }